

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O1

int fits_hdecompress64(uchar *input,int smooth,LONGLONG *a,int *ny,int *nx,int *scale,int *status)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  sbyte sVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long *plVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  LONGLONG *pLVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  uint n;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  double dVar39;
  uchar b [4];
  ulong local_150;
  undefined8 local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined8 local_e8;
  ulong local_e0;
  LONGLONG *local_d8;
  LONGLONG *local_d0;
  ulong local_c8;
  long local_c0;
  ulong local_b8;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  uint local_94;
  uint local_90;
  int local_8c;
  int local_88;
  char local_82 [2];
  long local_80;
  LONGLONG *local_78;
  ulong local_70;
  LONGLONG *local_68;
  long local_60;
  LONGLONG *local_58;
  LONGLONG *local_50;
  LONGLONG *local_48;
  LONGLONG *local_40;
  long local_38;
  
  iVar5 = *status;
  if (iVar5 < 1) {
    local_82 = *(char (*) [2])input;
    nextchar = 2;
    if (local_82 == code_magic) {
      uVar15 = *(uint *)(input + 2) & 0xff;
      lVar13 = 1;
      do {
        uVar15 = (uint)*(byte *)((long)&local_138 + lVar13) | uVar15 << 8;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      *nx = uVar15;
      uVar15 = *(uint *)(input + 6) & 0xff;
      lVar13 = 1;
      do {
        uVar15 = (uint)*(byte *)((long)&local_138 + lVar13) | uVar15 << 8;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      *ny = uVar15;
      uVar15 = *(uint *)(input + 10) & 0xff;
      lVar13 = 1;
      do {
        uVar15 = (uint)*(byte *)((long)&local_138 + lVar13) | uVar15 << 8;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      *scale = uVar15;
      local_138 = *(ulong *)(input + 0xe);
      uVar23 = local_138 & 0xff;
      lVar13 = 1;
      do {
        uVar23 = (ulong)*(byte *)((long)&local_138 + lVar13) | uVar23 << 8;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 8);
      bVar8 = input[0x16];
      local_128 = CONCAT44(local_128._4_4_,(uint)input[0x17]);
      local_130 = CONCAT44(local_130._4_4_,(uint)input[0x18]);
      nextchar = 0x19;
      uVar15 = *nx;
      local_100 = (ulong)uVar15;
      iVar6 = *ny;
      uVar17 = iVar6 * uVar15;
      iVar9 = (int)((uVar15 - ((int)(uVar15 + 1) >> 0x1f)) + 1) >> 1;
      iVar11 = (iVar6 - (iVar6 + 1 >> 0x1f)) + 1 >> 1;
      if (0 < (int)uVar17) {
        memset(a,0,(ulong)uVar17 << 3);
      }
      bits_to_go = 0;
      iVar5 = qtree_decode64(input,a,iVar6,iVar9,iVar11,(uint)bVar8);
      if (iVar5 == 0) {
        iVar5 = qtree_decode64(input,a + iVar11,iVar6,iVar9,iVar6 / 2,(int)local_128);
        if (iVar5 == 0) {
          local_108 = CONCAT44(local_108._4_4_,iVar6 / 2);
          iVar16 = (int)(((uint)(local_100 >> 0x1f) & 1) + (int)local_100) >> 1;
          iVar5 = qtree_decode64(input,a + iVar9 * iVar6,iVar6,iVar16,iVar11,(int)local_128);
          if (iVar5 == 0) {
            iVar5 = qtree_decode64(input,a + (iVar9 * iVar6 + iVar11),iVar6,iVar16,(int)local_108,
                                   (int)local_130);
            if (iVar5 == 0) {
              iVar5 = input_nybble(input);
              if (iVar5 == 0) {
                bits_to_go = 0;
                if ((int)uVar17 < 1) {
                  iVar5 = 0;
                }
                else {
                  uVar25 = 0;
                  uVar10 = 0;
                  lVar13 = nextchar;
                  uVar15 = buffer2;
                  do {
                    if (a[uVar25] != 0) {
                      if (uVar10 == 0) {
                        uVar15 = (uint)input[lVar13];
                        lVar13 = lVar13 + 1;
                        uVar10 = 8;
                        nextchar = lVar13;
                        buffer2 = uVar15;
                      }
                      uVar10 = uVar10 - 1;
                      bits_to_go = uVar10;
                      if ((uVar15 >> (uVar10 & 0x1f) & 1) != 0) {
                        a[uVar25] = -a[uVar25];
                      }
                    }
                    uVar25 = uVar25 + 1;
                    iVar5 = 0;
                  } while (uVar17 != uVar25);
                }
              }
              else {
                ffpmsg("dodecode64: bad bit plane values");
                iVar5 = 0x19e;
              }
            }
          }
        }
      }
      *a = uVar23;
    }
    else {
      ffpmsg("bad file format");
      iVar5 = 0x19e;
    }
    *status = iVar5;
    if (iVar5 == 0) {
      uVar15 = *nx;
      uVar17 = *ny;
      iVar5 = *scale;
      if ((1 < (long)iVar5) && (plVar12 = a, a <= a + (long)(int)(uVar17 * uVar15) + -1)) {
        do {
          *plVar12 = *plVar12 * (long)iVar5;
          plVar12 = plVar12 + 1;
        } while (plVar12 <= a + (long)(int)(uVar17 * uVar15) + -1);
      }
      uVar10 = uVar17;
      if ((int)uVar17 < (int)uVar15) {
        uVar10 = uVar15;
      }
      dVar39 = log((double)(int)uVar10);
      local_d0 = (LONGLONG *)
                 malloc((long)((int)((uVar10 - ((int)(uVar10 + 1) >> 0x1f)) + 1) >> 1) << 3);
      if (local_d0 == (LONGLONG *)0x0) {
        ffpmsg("hinv64: insufficient memory");
        iVar5 = 0x19e;
      }
      else {
        iVar9 = (int)(dVar39 / 0.6931471805599453 + 0.5);
        sVar4 = 1;
        bVar3 = 1 << ((byte)iVar9 & 0x1f) < (int)uVar10;
        iVar6 = (uint)bVar3 + iVar9;
        uVar10 = (iVar9 + (uint)bVar3) - 1;
        local_e0 = (ulong)uVar10;
        bVar8 = (byte)uVar10;
        uVar23 = 1L << (bVar8 & 0x3f);
        *a = (*a >> 0x3f) + *a + ((4L << (bVar8 & 0x3f)) >> 1) & uVar23 * -4;
        local_130 = -uVar23;
        if (0 < iVar6) {
          local_f8 = 1 << ((byte)iVar6 & 0x1f);
          uVar25 = 2L << (bVar8 & 0x3f);
          uVar31 = (long)uVar25 >> 1;
          local_108 = uVar31 - 1;
          local_70 = (ulong)(iVar5 >> 1);
          local_118 = (ulong)(uVar17 * 2);
          local_c8 = -local_70;
          local_a4 = uVar17 * 3;
          lVar13 = (long)(int)(uVar17 * 2);
          local_a8 = uVar17 * 3 + 2;
          local_80 = (long)(int)uVar17 << 3;
          local_78 = a + lVar13;
          local_60 = lVar13 * -8;
          local_68 = a + (2 - lVar13);
          local_ac = uVar17 * 2 + 2;
          local_d8 = a + 1;
          local_150 = 1;
          local_100 = uVar23;
          uVar27 = uVar23 * -2;
          uVar36 = 1;
          local_120 = (ulong)uVar17;
          local_b8 = uVar23;
          do {
            lVar13 = local_80;
            uVar14 = local_108;
            uVar23 = local_120;
            local_98 = (int)local_e0;
            local_100 = (long)local_100 >> 1;
            local_108 = local_100 - 1;
            local_f8 = local_f8 >> 1;
            local_9c = local_f8;
            if ((int)uVar15 <= local_f8) {
              local_9c = 0;
            }
            uVar10 = (int)local_150 * 2 - (uint)((int)uVar15 <= local_f8);
            local_150 = (ulong)uVar10;
            local_a0 = local_f8;
            if ((int)uVar17 <= local_f8) {
              local_a0 = 0;
            }
            n = (int)uVar36 * 2 - (uint)((int)uVar17 <= local_f8);
            uVar36 = (ulong)n;
            local_e0 = (ulong)(local_98 - 1);
            if (local_98 == 0) {
              sVar4 = 2;
              local_108 = 0;
            }
            pLVar18 = a;
            uVar35 = local_150;
            local_128 = uVar31;
            local_94 = uVar17;
            local_90 = uVar15;
            if (0 < (int)uVar10) {
              do {
                unshuffle64(pLVar18,n,1,local_d0);
                uVar35 = uVar35 - 1;
                pLVar18 = (LONGLONG *)((long)pLVar18 + lVar13);
              } while (uVar35 != 0);
            }
            pLVar18 = a;
            local_110 = uVar36;
            if (0 < (int)n) {
              do {
                unshuffle64(pLVar18,uVar10,(int)uVar23,local_d0);
                uVar36 = uVar36 - 1;
                pLVar18 = pLVar18 + 1;
              } while (uVar36 != 0);
            }
            iVar6 = (int)local_110;
            if (0 < iVar5 >> 1 && smooth != 0) {
              local_ec = uVar10 - 2;
              if (4 < (int)uVar10) {
                iVar11 = 2;
                uVar23 = local_118 & 0xffffffff;
                iVar9 = local_a4;
                do {
                  if (0 < iVar6) {
                    lVar13 = (long)(int)uVar23;
                    lVar28 = 0;
                    do {
                      lVar19 = *(long *)((long)a + lVar28 * 8 + local_60 + lVar13 * 8);
                      uVar35 = local_78[lVar13 + lVar28] - a[lVar13 + lVar28];
                      uVar36 = a[lVar13 + lVar28] - lVar19;
                      uVar31 = uVar36;
                      if ((long)uVar35 < (long)uVar36) {
                        uVar31 = uVar35;
                      }
                      if ((long)uVar36 < (long)uVar35) {
                        uVar36 = uVar35;
                      }
                      if ((long)uVar31 < 1) {
                        uVar31 = 0;
                      }
                      lVar32 = uVar31 * 4;
                      lVar38 = ((long)uVar36 >> 0x3f & uVar36) * 4;
                      if (lVar38 < lVar32) {
                        lVar19 = local_78[lVar13 + lVar28] - lVar19;
                        if (lVar19 < lVar32) {
                          lVar32 = lVar19;
                        }
                        if (lVar19 <= lVar38) {
                          lVar32 = lVar38;
                        }
                        uVar36 = lVar32 + a[iVar9 + lVar28] * -8;
                        uVar31 = (long)(uVar36 + 7) >> 3;
                        if (-1 < (long)uVar36) {
                          uVar31 = uVar36 >> 3;
                        }
                        if ((long)local_70 <= (long)uVar31) {
                          uVar31 = local_70;
                        }
                        if ((long)uVar31 <= (long)local_c8) {
                          uVar31 = local_c8;
                        }
                        a[iVar9 + lVar28] = uVar31 + a[iVar9 + lVar28];
                      }
                      lVar28 = lVar28 + 2;
                    } while ((int)lVar28 < iVar6);
                  }
                  iVar11 = iVar11 + 2;
                  iVar9 = iVar9 + (int)local_118;
                  uVar23 = (ulong)(uint)((int)uVar23 + (int)local_118);
                } while (iVar11 < local_ec);
              }
              if (0 < (int)uVar10) {
                iVar9 = 0;
                iVar11 = 2;
                do {
                  if (4 < iVar6) {
                    lVar13 = 2;
                    do {
                      uVar36 = a[iVar11 + lVar13] - a[(long)iVar11 + lVar13 + -2];
                      uVar23 = a[(long)iVar11 + lVar13 + -2] - a[(long)iVar11 + lVar13 + -4];
                      uVar31 = uVar23;
                      if ((long)uVar36 < (long)uVar23) {
                        uVar31 = uVar36;
                      }
                      if ((long)uVar23 < (long)uVar36) {
                        uVar23 = uVar36;
                      }
                      if ((long)uVar31 < 1) {
                        uVar31 = 0;
                      }
                      lVar28 = uVar31 * 4;
                      lVar19 = ((long)uVar23 >> 0x3f & uVar23) * 4;
                      if (lVar19 < lVar28) {
                        lVar32 = a[iVar11 + lVar13] - a[(long)iVar11 + lVar13 + -4];
                        if (lVar32 < lVar28) {
                          lVar28 = lVar32;
                        }
                        if (lVar32 <= lVar19) {
                          lVar28 = lVar19;
                        }
                        uVar31 = lVar28 + a[(long)iVar11 + lVar13 + -1] * -8;
                        uVar23 = (long)(uVar31 + 7) >> 3;
                        if (-1 < (long)uVar31) {
                          uVar23 = uVar31 >> 3;
                        }
                        if ((long)local_70 <= (long)uVar23) {
                          uVar23 = local_70;
                        }
                        if ((long)uVar23 <= (long)local_c8) {
                          uVar23 = local_c8;
                        }
                        a[(long)iVar11 + lVar13 + -1] = uVar23 + a[(long)iVar11 + lVar13 + -1];
                      }
                      lVar13 = lVar13 + 2;
                    } while ((int)lVar13 < iVar6 + -2);
                  }
                  iVar9 = iVar9 + 2;
                  iVar11 = iVar11 + (int)local_118;
                } while (iVar9 < (int)uVar10);
              }
              if (4 < (int)uVar10) {
                local_88 = iVar6 + -2;
                local_f0 = local_ac;
                local_f4 = local_a8;
                iVar9 = 2;
                do {
                  local_8c = iVar9;
                  if (4 < iVar6) {
                    lVar13 = (long)local_f0;
                    local_40 = a + lVar13;
                    local_48 = local_78 + lVar13 + 2;
                    local_50 = local_68 + lVar13;
                    local_58 = local_d8 + local_f4;
                    lVar13 = 0;
                    do {
                      local_38 = local_50[lVar13];
                      local_c0 = local_48[lVar13 + -4];
                      local_e8 = local_48[lVar13];
                      lVar38 = local_58[lVar13 + -1];
                      lVar32 = local_40[lVar13];
                      lVar20 = local_e8 - lVar32;
                      lVar24 = lVar32 - local_c0;
                      lVar19 = local_50[lVar13 + -4] - lVar32;
                      lVar32 = lVar32 - local_38;
                      lVar28 = 0;
                      if (0 < lVar19) {
                        lVar28 = lVar19;
                      }
                      if (-1 < lVar19) {
                        lVar19 = 0;
                      }
                      lVar29 = 0;
                      if (0 < lVar32) {
                        lVar29 = lVar32;
                      }
                      if (-1 < lVar32) {
                        lVar32 = 0;
                      }
                      lVar34 = 0;
                      if (0 < lVar24) {
                        lVar34 = lVar24;
                      }
                      if (-1 < lVar24) {
                        lVar24 = 0;
                      }
                      lVar37 = 0;
                      if (0 < lVar20) {
                        lVar37 = lVar20;
                      }
                      lVar2 = local_40[lVar13 + 1];
                      if (-1 < lVar20) {
                        lVar20 = 0;
                      }
                      lVar1 = lVar38 * 2 + lVar2 * 2;
                      lVar37 = lVar37 - lVar1;
                      lVar34 = lVar34 + lVar38 * 2 + lVar2 * -2;
                      if (lVar37 < lVar34) {
                        lVar34 = lVar37;
                      }
                      lVar28 = lVar28 + lVar38 * 2;
                      lVar29 = lVar29 + lVar38 * -2;
                      if (lVar28 <= lVar29) {
                        lVar29 = lVar28;
                      }
                      lVar29 = lVar29 + lVar2 * 2;
                      if (lVar29 <= lVar34) {
                        lVar34 = lVar29;
                      }
                      lVar20 = lVar20 - lVar1;
                      lVar28 = lVar24 + lVar38 * 2 + lVar2 * -2;
                      lVar34 = lVar34 * 0x10;
                      if (lVar28 < lVar20) {
                        lVar28 = lVar20;
                      }
                      lVar32 = lVar32 + lVar38 * -2;
                      lVar19 = lVar19 + lVar38 * 2;
                      if (lVar32 <= lVar19) {
                        lVar32 = lVar19;
                      }
                      lVar32 = lVar32 + lVar2 * 2;
                      if (lVar28 <= lVar32) {
                        lVar28 = lVar32;
                      }
                      lVar28 = lVar28 * 0x10;
                      if (lVar28 < lVar34) {
                        lVar19 = (local_50[lVar13 + -4] - (local_c0 + local_38)) + local_e8;
                        if (lVar19 < lVar34) {
                          lVar34 = lVar19;
                        }
                        if (lVar19 <= lVar28) {
                          lVar34 = lVar28;
                        }
                        uVar31 = lVar34 + local_58[lVar13] * -0x40;
                        uVar23 = (long)(uVar31 + 0x3f) >> 6;
                        if (-1 < (long)uVar31) {
                          uVar23 = uVar31 >> 6;
                        }
                        if ((long)local_70 <= (long)uVar23) {
                          uVar23 = local_70;
                        }
                        if ((long)uVar23 <= (long)local_c8) {
                          uVar23 = local_c8;
                        }
                        local_58[lVar13] = uVar23 + local_58[lVar13];
                      }
                      iVar9 = (int)lVar13;
                      lVar13 = lVar13 + 2;
                    } while (iVar9 + 4 < local_88);
                  }
                  local_f4 = local_f4 + (int)local_118;
                  local_f0 = local_f0 + (int)local_118;
                  iVar9 = local_8c + 2;
                } while (local_8c + 2 < local_ec);
              }
            }
            uVar15 = uVar10 - ((int)uVar10 >> 0x1f);
            iVar9 = iVar6 - (((uint)(local_110 >> 0x1f) & 1) + iVar6 & 0xfffffffe);
            local_e8 = CONCAT44(local_e8._4_4_,uVar15) & 0xfffffffffffffffe;
            iVar11 = (int)local_120;
            if ((int)(uVar15 & 0xfffffffe) < 1) {
              iVar16 = 0;
            }
            else {
              lVar13 = 0;
              iVar16 = 0;
              local_c0 = CONCAT44(local_c0._4_4_,iVar9);
              uVar23 = local_120;
              do {
                if (iVar6 - iVar9 < 1) {
                  iVar26 = iVar16 * iVar11;
                  iVar30 = iVar26 + iVar11;
                }
                else {
                  iVar30 = (int)uVar23;
                  iVar22 = (int)lVar13;
                  lVar28 = 0;
                  do {
                    uVar31 = local_128;
                    if (local_d8[(long)iVar30 + lVar28 + -1] < 0) {
                      uVar31 = uVar14;
                    }
                    uVar36 = uVar31 + local_d8[(long)iVar30 + lVar28 + -1] & uVar27;
                    uVar31 = local_128;
                    if (local_d8[iVar22 + lVar28] < 0) {
                      uVar31 = uVar14;
                    }
                    uVar35 = uVar31 + local_d8[iVar22 + lVar28] & uVar27;
                    uVar31 = local_100;
                    if (local_d8[iVar30 + lVar28] < 0) {
                      uVar31 = local_108;
                    }
                    uVar7 = uVar31 + local_d8[iVar30 + lVar28] & local_130;
                    uVar33 = uVar7 & local_b8;
                    uVar31 = -uVar33;
                    if ((long)uVar36 < 0) {
                      uVar31 = uVar33;
                    }
                    uVar31 = uVar31 + uVar36;
                    lVar19 = local_d8[(long)iVar22 + lVar28 + -1];
                    uVar36 = -uVar33;
                    if ((long)uVar35 < 0) {
                      uVar36 = uVar33;
                    }
                    uVar36 = uVar36 + uVar35;
                    uVar35 = (uVar31 ^ uVar7 ^ uVar36) & uVar25;
                    if (lVar19 < 0) {
                      uVar21 = uVar33 - uVar35;
                      if (uVar33 == 0) {
                        uVar21 = uVar35;
                      }
                      lVar19 = uVar21 + lVar19;
                    }
                    else {
                      lVar19 = (uVar33 + lVar19) - uVar35;
                    }
                    local_d8[iVar30 + lVar28] = (long)(lVar19 + uVar31 + uVar36 + uVar7) >> sVar4;
                    local_d8[(long)iVar30 + lVar28 + -1] =
                         (long)((lVar19 + uVar31) - (uVar36 + uVar7)) >> sVar4;
                    local_d8[iVar22 + lVar28] =
                         (long)((uVar36 - uVar7) + (lVar19 - uVar31)) >> sVar4;
                    local_d8[(long)iVar22 + lVar28 + -1] =
                         (long)((uVar7 - uVar36) + (lVar19 - uVar31)) >> sVar4;
                    lVar28 = lVar28 + 2;
                    iVar26 = (int)lVar28;
                  } while (iVar26 < iVar6 - iVar9);
                  iVar30 = iVar30 + iVar26;
                  iVar26 = iVar26 + iVar22;
                }
                if (iVar9 != 0) {
                  uVar31 = local_128;
                  if (a[iVar30] < 0) {
                    uVar31 = uVar14;
                  }
                  uVar36 = uVar31 + a[iVar30] & uVar27;
                  uVar31 = -(uVar36 & uVar25);
                  if (a[iVar26] < 0) {
                    uVar31 = uVar36 & uVar25;
                  }
                  lVar28 = uVar31 + a[iVar26];
                  a[iVar30] = (long)(lVar28 + uVar36) >> sVar4;
                  a[iVar26] = (long)(lVar28 - uVar36) >> sVar4;
                }
                iVar16 = iVar16 + 2;
                lVar13 = lVar13 + local_118;
                uVar23 = uVar23 + local_118;
              } while (iVar16 < (int)(uint)local_e8);
            }
            if (uVar10 != (uint)local_e8) {
              iVar16 = iVar16 * iVar11;
              if (iVar9 < iVar6) {
                lVar13 = 0;
                do {
                  uVar23 = local_128;
                  if (local_d8[iVar16 + lVar13] < 0) {
                    uVar23 = uVar14;
                  }
                  uVar31 = uVar23 + local_d8[iVar16 + lVar13] & uVar27;
                  uVar23 = -(uVar31 & uVar25);
                  if (local_d8[(long)iVar16 + lVar13 + -1] < 0) {
                    uVar23 = uVar31 & uVar25;
                  }
                  lVar28 = uVar23 + local_d8[(long)iVar16 + lVar13 + -1];
                  local_d8[iVar16 + lVar13] = (long)(lVar28 + uVar31) >> sVar4;
                  local_d8[(long)iVar16 + lVar13 + -1] = (long)(lVar28 - uVar31) >> sVar4;
                  lVar13 = lVar13 + 2;
                } while ((int)lVar13 < iVar6 - iVar9);
                iVar16 = iVar16 + (int)lVar13;
              }
              if (iVar9 != 0) {
                a[iVar16] = a[iVar16] >> sVar4;
              }
            }
            uVar15 = local_90 - local_9c;
            uVar17 = local_94 - local_a0;
            uVar23 = (long)local_b8 >> 1;
            uVar14 = (long)local_130 >> 1;
            uVar25 = local_b8;
            uVar27 = local_130;
            uVar31 = local_100;
            uVar36 = local_110;
            local_130 = uVar14;
            local_b8 = uVar23;
          } while (0 < local_98);
        }
        free(local_d0);
        iVar5 = 0;
      }
      *status = iVar5;
      iVar5 = *ny;
      iVar6 = *nx;
      if (0 < iVar5 * iVar6) {
        uVar23 = 0;
        do {
          *(int *)((long)a + uVar23 * 4) = (int)a[uVar23];
          uVar23 = uVar23 + 1;
        } while ((uint)(iVar5 * iVar6) != uVar23);
      }
      iVar5 = *status;
    }
  }
  return iVar5;
}

Assistant:

int fits_hdecompress64(unsigned char *input, int smooth, LONGLONG *a, int *ny, int *nx, 
                     int *scale, int *status)
{
  /* 
     decompress the input byte stream using the H-compress algorithm
  
   input  - input array of compressed bytes
   a - pre-allocated array to hold the output uncompressed image
   nx - returned X axis size
   ny - returned Y axis size

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */
  int stat, *iarray, ii, nval;

  if (*status > 0) return(*status);

	/* decode the input array */

        FFLOCK;  /* decode uses the nextchar global variable */
	stat = decode64(input, a, nx, ny, scale);
        FFUNLOCK;

        *status = stat;
	if (stat) return(*status);
	
	/*
	 * Un-Digitize
	 */
	undigitize64(a, *nx, *ny, *scale);

	/*
	 * Inverse H-transform
	 */
	stat = hinv64(a, *nx, *ny, smooth, *scale);

        *status = stat;
	
         /* pack the I*8 values back into an I*4 array */
        iarray = (int *) a;
	nval = (*nx) * (*ny);

	for (ii = 0; ii < nval; ii++)
	   iarray[ii] = (int) a[ii];	

  return(*status);
}